

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_ihdr(spng_ctx *ctx,spng_ihdr *ihdr)

{
  spng_chunk_bitfield sVar1;
  uint32_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  undefined3 uVar8;
  int iVar9;
  
  iVar9 = 1;
  if ((ihdr != (spng_ihdr *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar9 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar9 = read_chunks(ctx,0), iVar9 == 0)))) {
    sVar1 = ctx->stored;
    iVar9 = 1;
    if ((((uint)sVar1 & 1) == 0) &&
       (iVar9 = check_ihdr(ihdr,ctx->max_width,ctx->max_height), iVar9 == 0)) {
      uVar2 = ihdr->height;
      uVar3 = ihdr->bit_depth;
      uVar4 = ihdr->color_type;
      uVar5 = ihdr->compression_method;
      uVar6 = ihdr->filter_method;
      uVar7 = ihdr->interlace_method;
      uVar8 = *(undefined3 *)&ihdr->field_0xd;
      (ctx->ihdr).width = ihdr->width;
      (ctx->ihdr).height = uVar2;
      (ctx->ihdr).bit_depth = uVar3;
      (ctx->ihdr).color_type = uVar4;
      (ctx->ihdr).compression_method = uVar5;
      (ctx->ihdr).filter_method = uVar6;
      (ctx->ihdr).interlace_method = uVar7;
      *(undefined3 *)&(ctx->ihdr).field_0xd = uVar8;
      ctx->stored = (spng_chunk_bitfield)((uint)sVar1 | 1);
      *(byte *)&ctx->user = *(byte *)&ctx->user | 1;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int spng_set_ihdr(spng_ctx *ctx, struct spng_ihdr *ihdr)
{
    SPNG_SET_CHUNK_BOILERPLATE(ihdr);

    if(ctx->stored.ihdr) return 1;

    ret = check_ihdr(ihdr, ctx->max_width, ctx->max_height);
    if(ret) return ret;

    ctx->ihdr = *ihdr;

    ctx->stored.ihdr = 1;
    ctx->user.ihdr = 1;

    return 0;
}